

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O2

int act_disp_hdrs(nt_opts *opts)

{
  uint uVar1;
  char **ppcVar2;
  FILE *__stream;
  int iVar3;
  nifti_1_header *hdr;
  field_s *fieldp;
  uint nfields;
  char *pcVar4;
  long lVar5;
  long lVar6;
  
  uVar1 = (opts->flist).len;
  nfields = 0x2b;
  if (0 < (int)uVar1) {
    nfields = uVar1;
  }
  if (2 < g_debug) {
    fprintf(_stderr,"-d displaying %d fields for %d nifti datasets...\n",(ulong)nfields);
  }
  lVar6 = 0;
  while( true ) {
    if ((opts->infiles).len <= lVar6) {
      return 0;
    }
    hdr = nt_read_header(opts,(opts->infiles).list[lVar6],(int *)0x0,0);
    if (hdr == (nifti_1_header *)0x0) break;
    if ((0 < g_debug) &&
       (fprintf(_stdout,"\nheader file \'%s\', num_fields = %d\n",(opts->infiles).list[lVar6]),
       __stream = _stderr, 1 < g_debug)) {
      iVar3 = nifti_hdr_looks_good(hdr);
      pcVar4 = "valid";
      if (iVar3 == 0) {
        pcVar4 = "invalid";
      }
      fprintf(__stream,"-d header is: %s\n",pcVar4);
    }
    iVar3 = (opts->flist).len;
    if (iVar3 < 1) {
      disp_field("\nall fields:\n",g_hdr_fields,hdr,nfields,(uint)(0 < g_debug));
    }
    else {
      ppcVar2 = (opts->flist).list;
      for (lVar5 = 0; (int)lVar5 < iVar3; lVar5 = lVar5 + 1) {
        fieldp = get_hdr_field(ppcVar2[lVar5],(uint)(lVar6 == 0));
        if (fieldp != (field_s *)0x0) {
          disp_field((char *)0x0,fieldp,hdr,1,(uint)((int)lVar5 == 0 && 0 < g_debug));
        }
        iVar3 = (opts->flist).len;
      }
    }
    free(hdr);
    lVar6 = lVar6 + 1;
  }
  return 1;
}

Assistant:

int act_disp_hdrs( nt_opts * opts )
{
   nifti_1_header *  nhdr;
   field_s        *  fnhdr;
   char           ** sptr;
   int               nfields, filenum, fc;

   /* set the number of fields to display */
   nfields = opts->flist.len > 0 ? opts->flist.len : NT_HDR_NUM_FIELDS;

   if( g_debug > 2 )
      fprintf(stderr,"-d displaying %d fields for %d nifti datasets...\n",
              nfields, opts->infiles.len);

   for( filenum = 0; filenum < opts->infiles.len; filenum++ )
   {
      /* do not validate the header structure */
      nhdr = nt_read_header(opts, opts->infiles.list[filenum], NULL, 0);
      if( !nhdr ) return 1;  /* errors are printed from library */

      if( g_debug > 0 )
         fprintf(stdout,"\nheader file '%s', num_fields = %d\n",
                 opts->infiles.list[filenum], nfields);
      if( g_debug > 1 )
         fprintf(stderr,"-d header is: %s\n",
                 nifti_hdr_looks_good(nhdr) ? "valid" : "invalid");

      if( opts->flist.len <= 0 ) /* then display all fields */
         disp_field("\nall fields:\n", g_hdr_fields, nhdr, nfields, g_debug>0);
      else  /* print only the requested fields... */
      {
         /* must locate each field before printing it */
         sptr = opts->flist.list;
         for( fc = 0; fc < opts->flist.len; fc++ )
         {
            fnhdr = get_hdr_field(*sptr, filenum == 0);
            if( fnhdr ) disp_field(NULL, fnhdr, nhdr, 1, g_debug>0 && fc == 0);
            sptr++;
         }
      }

      free(nhdr);
   }

   return 0;
}